

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O1

void __thiscall
MarkerIndex::Iterator::seek_to_first_node_greater_than_or_equal_to(Iterator *this,Point *position)

{
  Point *other;
  bool bVar1;
  Node *local_38;
  Point local_30;
  
  other = &this->current_node_position;
  local_38 = this->current_node;
  local_30 = this->current_node_position;
  std::
  _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
            ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->marker_index->node_position_cache);
  bVar1 = Point::operator==(position,other);
  while (!bVar1) {
    bVar1 = Point::operator<(position,other);
    if (bVar1) {
      if (this->current_node->left == (Node *)0x0) break;
      descend_left(this);
    }
    else {
      if (this->current_node->right == (Node *)0x0) break;
      descend_right(this);
    }
    local_38 = this->current_node;
    local_30 = this->current_node_position;
    std::
    _Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<MarkerIndex::Node_const*const,Point>>
              ((_Hashtable<MarkerIndex::Node_const*,std::pair<MarkerIndex::Node_const*const,Point>,std::allocator<std::pair<MarkerIndex::Node_const*const,Point>>,std::__detail::_Select1st,std::equal_to<MarkerIndex::Node_const*>,std::hash<MarkerIndex::Node_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->marker_index->node_position_cache,&local_38);
    bVar1 = Point::operator==(position,other);
  }
  bVar1 = Point::operator<(other,position);
  if (bVar1) {
    move_to_successor(this);
  }
  return;
}

Assistant:

void MarkerIndex::Iterator::seek_to_first_node_greater_than_or_equal_to(const Point &position) {
  while (true) {
    cache_node_position();
    if (position == current_node_position) {
      break;
    } else if (position < current_node_position) {
      if (current_node->left) {
        descend_left();
      } else {
        break;
      }
    } else { // position > current_node_position
      if (current_node->right) {
        descend_right();
      } else {
        break;
      }
    }
  }

  if (current_node_position < position) move_to_successor();
}